

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O2

void qsub(char *qtag,int flags)

{
  char cVar1;
  int qnum;
  int vnum;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  ushort **ppuVar5;
  undefined8 uVar6;
  char *__format;
  
  ::qnum = atoi(qtag);
  if (qsub::line == (char *)0x0) {
    pcVar3 = (char *)malloc(0x2000);
    qsub::line = pcVar3;
    qsub::qpath = (char *)malloc(0x2000);
    if (pcVar3 == (char *)0x0) {
      uVar6 = 0x90;
    }
    else {
      if (qsub::qpath != (char *)0x0) goto LAB_00103d55;
      uVar6 = 0x91;
    }
    fprintf(_stderr,"Malloc failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",uVar6
           );
  }
  else {
LAB_00103d55:
    pcVar3 = env_config("DSS_QUERY",".");
    sprintf(qsub::qpath,"%s%c%s.sql",pcVar3,0x2f,qtag);
    __stream = fopen64(qsub::qpath,"r");
    if (__stream != (FILE *)0x0) {
      rowcnt = rowcnt_dflt[::qnum];
      varsub(::qnum,0,flags);
      if (((uint)flags >> 0xe & 1) != 0) {
        fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
      }
LAB_00103e0a:
      pcVar3 = fgets(qsub::line,0x2000,__stream);
      if (pcVar3 == (char *)0x0) {
        fclose(__stream);
        fflush(_stdout);
        return;
      }
      pcVar3 = qsub::line;
      if (((uint)flags >> 0xb & 1) == 0) {
        strip_comments(qsub::line);
        pcVar3 = qsub::line;
      }
LAB_00103e42:
      pcVar4 = strchr(pcVar3,0x3a);
      if (pcVar4 == (char *)0x0) goto LAB_0010405f;
      *pcVar4 = '\0';
      fputs(pcVar3,_stdout);
      qnum = ::qnum;
      cVar1 = pcVar4[1];
      switch(cVar1) {
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        pcVar3 = pcVar4 + 1;
        vnum = atoi(pcVar3);
        varsub(qnum,vnum,flags & 1);
        ppuVar5 = __ctype_b_loc();
        do {
          pcVar4 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
        } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar4 * 2 + 1) & 8) != 0);
        goto LAB_00103e42;
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'D':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'P':
      case 'R':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
        goto switchD_00103e7b_caseD_3a;
      case 'B':
switchD_00103e7b_caseD_42:
        if (((uint)flags >> 9 & 1) == 0) {
          __format = "%s\n";
          pcVar3 = "";
LAB_0010402d:
          fprintf(_stdout,__format,pcVar3);
        }
        break;
      case 'C':
switchD_00103e7b_caseD_43:
        if ((flags & 8U) != 0) {
          __format = "CONNECT TO %s ;\n";
          pcVar3 = db_name;
          goto LAB_0010402d;
        }
        break;
      case 'E':
switchD_00103e7b_caseD_45:
        if (((uint)flags >> 9 & 1) == 0) {
          __format = "%s\n";
          pcVar3 = "COMMIT WORK;";
          goto LAB_0010402d;
        }
        break;
      case 'N':
        goto switchD_00103e7b_caseD_4e;
      case 'O':
switchD_00103e7b_caseD_4f:
        if ((flags & 2U) != 0) {
          uVar2 = snum;
          if (snum < 1) {
            uVar2 = 0;
          }
          fprintf(_stdout,"%s \'%s/%s.%d\'","",osuff,qtag,(ulong)uVar2);
        }
        break;
      case 'Q':
switchD_00103e7b_caseD_51:
        fputs(qtag,_stdout);
        break;
      case 'S':
switchD_00103e7b_caseD_53:
        uVar2 = snum;
        if (snum < 1) {
          uVar2 = 0;
        }
        fprintf(_stdout,"%d",(ulong)uVar2);
        break;
      case 'X':
switchD_00103e7b_caseD_58:
        if ((flags & 4U) != 0) {
          __format = "%s\n";
          pcVar3 = "SET CURRENT EXPLAIN SNAPSHOT ON;";
          goto LAB_0010402d;
        }
        break;
      default:
        switch(cVar1) {
        case 'n':
          goto switchD_00103e7b_caseD_4e;
        case 'o':
          goto switchD_00103e7b_caseD_4f;
        case 'p':
        case 'r':
        case 't':
        case 'u':
        case 'v':
        case 'w':
          break;
        case 'q':
          goto switchD_00103e7b_caseD_51;
        case 's':
          goto switchD_00103e7b_caseD_53;
        case 'x':
          goto switchD_00103e7b_caseD_58;
        default:
          if (cVar1 == 'e') goto switchD_00103e7b_caseD_45;
          if (cVar1 == 'c') goto switchD_00103e7b_caseD_43;
          if (cVar1 == 'b') goto switchD_00103e7b_caseD_42;
        }
        goto switchD_00103e7b_caseD_3a;
      }
      goto LAB_00104034;
    }
    fprintf(_stderr,"Open failed for %s at %s:%d\n",qsub::qpath,
            "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",0x98)
    ;
  }
  exit(1);
switchD_00103e7b_caseD_4e:
  if (((uint)flags >> 0xe & 1) == 0) {
    pcVar4 = pcVar4 + 2;
    uVar2 = atoi(pcVar4);
    rowcnt = uVar2;
    ppuVar5 = __ctype_b_loc();
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((long)cVar1 == 0x20);
    } while (((*ppuVar5)[cVar1] & 0x800) != 0);
    fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)uVar2);
  }
  goto LAB_00103e42;
switchD_00103e7b_caseD_3a:
  fprintf(_stderr,"-- unknown flag \'%c%c\' ignored\n",0x3a,(ulong)(uint)(int)cVar1);
LAB_00104034:
  pcVar3 = pcVar4 + 2;
  goto LAB_00103e42;
LAB_0010405f:
  fputs(pcVar3,_stdout);
  goto LAB_00103e0a;
}

Assistant:

void
qsub(char *qtag, int flags)
{
static char *line = NULL,
    *qpath = NULL;
FILE *qfp;
char *cptr,
    *mark,
    *qroot = NULL;

    qnum = atoi(qtag);
    if (line == NULL)
        {
        line = malloc(BUFSIZ);
        qpath = malloc(BUFSIZ);
        MALLOC_CHECK(line);
        MALLOC_CHECK(qpath);
        }

    qroot = env_config(QDIR_TAG, QDIR_DFLT);
    sprintf(qpath, "%s%c%s.sql", 
		qroot, PATH_SEP, qtag);
    qfp = fopen(qpath, "r");
    OPEN_CHECK(qfp, qpath);

    rowcnt = rowcnt_dflt[qnum];
    varsub(qnum, 0, flags); /* set the variables */
    if (flags & DFLT_NUM)
        fprintf(ofp, SET_ROWCOUNT, rowcnt);
    while (fgets(line, BUFSIZ, qfp) != NULL)
        {
        if (!(flags & COMMENT))
            strip_comments(line);
        mark = line;
        while ((cptr = strchr(mark, VTAG)) != NULL)
            {
            *cptr = '\0';
             cptr++;
            fprintf(ofp,"%s", mark);
            switch(*cptr)
                {
                case 'b':
                case 'B':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", START_TRAN);
                    cptr++;
                    break;
                case 'c':
                case 'C':
                    if (flags & DBASE)
                        fprintf(ofp, SET_DBASE, db_name);
                    cptr++;
                    break;
                case 'e':
                case 'E':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", END_TRAN);
                    cptr++;
                    break;
                case 'n':
                case 'N':
                    if (!(flags & DFLT_NUM))
                        {
                        rowcnt=atoi(++cptr);
                        while (isdigit(*cptr) || *cptr == ' ') cptr++;
                        fprintf(ofp, SET_ROWCOUNT, rowcnt);
                        }
                    continue;
                case 'o':
                case 'O':
                    if (flags & OUTPUT)
                        fprintf(ofp,"%s '%s/%s.%d'", SET_OUTPUT, osuff, 
                            qtag, (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'q':
                case 'Q':
                    fprintf(ofp,"%s", qtag);
                    cptr++;
                    break;
                case 's':
                case 'S':
                    fprintf(ofp,"%d", (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'X':
                case 'x':
                    if (flags & EXPLAIN)
                        fprintf(ofp, "%s\n", GEN_QUERY_PLAN);
                    cptr++;
                    break;
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
                    varsub(qnum, atoi(cptr), flags & DFLT);
                    while (isdigit(*++cptr));
                    break;
                default:
		    fprintf(stderr, "-- unknown flag '%c%c' ignored\n", 
                        VTAG, *cptr);
		    cptr++;
		    break;
                }
            mark=cptr;
            }
        fprintf(ofp,"%s", mark);
        }
    fclose(qfp);
    fflush(stdout);
    return;
}